

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_tuple_management.hpp
# Opt level: O0

void burst::management::manage<std::unique_ptr<int,std::default_delete<int>>>
               (operation_t todo,void *source,void *destination)

{
  void *destination_local;
  void *source_local;
  operation_t todo_local;
  
  switch(todo) {
  case copy:
    copy<std::unique_ptr<int,std::default_delete<int>>>(source,destination);
    break;
  case move:
    move<std::unique_ptr<int,std::default_delete<int>>>(source,destination);
    break;
  case destroy:
    if (source != (void *)0x0) {
      __assert_fail("source == nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/container/detail/dynamic_tuple_management.hpp"
                    ,0x56,
                    "void burst::management::manage(operation_t, const void *, void *) [T = std::unique_ptr<int>]"
                   );
    }
    destroy<std::unique_ptr<int,std::default_delete<int>>>(destination);
    break;
  case size:
    if (source != (void *)0x0) {
      __assert_fail("source == nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/container/detail/dynamic_tuple_management.hpp"
                    ,0x5c,
                    "void burst::management::manage(operation_t, const void *, void *) [T = std::unique_ptr<int>]"
                   );
    }
    *(undefined8 *)destination = 8;
    break;
  case type:
    if (source != (void *)0x0) {
      __assert_fail("source == nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/container/detail/dynamic_tuple_management.hpp"
                    ,0x62,
                    "void burst::management::manage(operation_t, const void *, void *) [T = std::unique_ptr<int>]"
                   );
    }
    *(pointer_____offset_0x10___ **)destination =
         &std::unique_ptr<int,std::default_delete<int>>::typeinfo;
  }
  return;
}

Assistant:

void manage (operation_t todo, const void * source, void * destination)
        {
            switch (todo)
            {
                case operation_t::copy:
                {
                    copy<T>(source, destination);
                    break;
                }
                case operation_t::move:
                {
                    move<T>(const_cast<void *>(source), destination);
                    break;
                }
                case operation_t::destroy:
                {
                    assert(source == nullptr);
                    destroy<T>(destination);
                    break;
                }
                case operation_t::size:
                {
                    assert(source == nullptr);
                    *static_cast<std::size_t *>(destination) = sizeof(T);
                    break;
                }
                case operation_t::type:
                {
                    assert(source == nullptr);
                    *static_cast<const std::type_info **>(destination) = std::addressof(typeid(T));
                    break;
                }
            }
        }